

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplerng.c
# Opt level: O0

int simplerng_poisson_small(double lambda)

{
  int iVar1;
  double dVar2;
  double dVar3;
  undefined4 local_24;
  int k;
  double L;
  double p;
  double lambda_local;
  
  L = 1.0;
  dVar2 = exp(-lambda);
  local_24 = 0;
  iVar1 = local_24;
  do {
    local_24 = iVar1;
    dVar3 = simplerng_getuniform();
    L = dVar3 * L;
    iVar1 = local_24 + 1;
  } while (dVar2 < L);
  return local_24;
}

Assistant:

int simplerng_poisson_small(double lambda)
{
  /* Algorithm due to Donald Knuth, 1969. */
  double p = 1.0, L = exp(-lambda);
  int k = 0;
  do {
    k++;
    p *= simplerng_getuniform();
  }
  while (p > L);
  return k - 1;
}